

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shop.cpp
# Opt level: O2

void __thiscall SHOPManagement::Shop::saveAddress(Shop *this)

{
  Address *this_00;
  int iVar1;
  pointer ppUVar2;
  long lVar3;
  ostream *poVar4;
  undefined8 *puVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  stringstream ss;
  allocator<char> local_209;
  string local_208;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e8;
  pointer local_1d0;
  pointer local_1c8;
  undefined8 *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [8];
  string local_1a0 [368];
  
  local_1e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_1d0 = (this->v_users).
              super__Vector_base<SHOPManagement::User_*,_std::allocator<SHOPManagement::User_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  ppUVar2 = (this->v_users).
            super__Vector_base<SHOPManagement::User_*,_std::allocator<SHOPManagement::User_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  while (ppUVar2 != local_1d0) {
    local_1c8 = ppUVar2;
    lVar3 = __dynamic_cast(*ppUVar2,&User::typeinfo,&Person::typeinfo,0);
    local_1c0 = *(undefined8 **)(lVar3 + 0xb8);
    for (puVar5 = *(undefined8 **)(lVar3 + 0xb0); puVar5 != local_1c0; puVar5 = puVar5 + 1) {
      this_00 = (Address *)*puVar5;
      iVar1 = Address::getPid(this_00);
      poVar4 = (ostream *)std::ostream::operator<<(local_1a8,iVar1);
      std::operator<<(poVar4,"|");
      Address::getName_abi_cxx11_(&local_208,this_00);
      poVar4 = std::operator<<(local_1a8,(string *)&local_208);
      std::operator<<(poVar4,"|");
      std::__cxx11::string::~string((string *)&local_208);
      Address::getCountry_abi_cxx11_(&local_208,this_00);
      poVar4 = std::operator<<(local_1a8,(string *)&local_208);
      std::operator<<(poVar4,"|");
      std::__cxx11::string::~string((string *)&local_208);
      Address::getCity_abi_cxx11_(&local_208,this_00);
      poVar4 = std::operator<<(local_1a8,(string *)&local_208);
      std::operator<<(poVar4,"|");
      std::__cxx11::string::~string((string *)&local_208);
      Address::getStreet_abi_cxx11_(&local_208,this_00);
      std::operator<<(local_1a8,(string *)&local_208);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::stringbuf::str();
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1e8,
                 &local_208);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"",&local_209);
      std::__cxx11::stringbuf::str(local_1a0);
      std::__cxx11::string::~string((string *)&local_208);
    }
    ppUVar2 = local_1c8 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,"data/ADDRESSES.dat",&local_209);
  Helper::saveFileByLine(&local_208,&local_1e8);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1e8);
  return;
}

Assistant:

void Shop::saveAddress()
    {
        std::vector<std::string> lines;
        std::stringstream ss;

        for (auto current : this->v_users)
        {
            Person *pPerson = dynamic_cast<Person *>(current);

            for (auto current_address : pPerson->v_adress_list)
            {
                ss << current_address->getPid() << "|";
                ss << current_address->getName() << "|";
                ss << current_address->getCountry() << "|";
                ss << current_address->getCity() << "|";
                ss << current_address->getStreet();
                lines.push_back(ss.str());
                ss.str("");
            }
        }

        Helper::saveFileByLine("data/ADDRESSES.dat", lines);
    }